

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O3

char * QTest::toString(QObject *o)

{
  undefined8 uVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  QArrayData *local_50;
  undefined8 *local_48;
  QArrayData *local_38;
  longlong local_30;
  long local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (o == (QObject *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      pcVar2 = (char *)qstrdup("<null>");
      return pcVar2;
    }
  }
  else {
    QObject::objectName();
    (*(code *)**(undefined8 **)o)(o);
    uVar1 = QMetaObject::className();
    pcVar2 = (char *)operator_new__(0x100);
    if (local_28 == 0) {
      snprintf(pcVar2,0x100,"%s/%p",uVar1,o);
    }
    else {
      QString::toLocal8Bit_helper((QChar *)&local_50,local_30);
      if (local_48 == (undefined8 *)0x0) {
        local_48 = &QByteArray::_empty;
      }
      snprintf(pcVar2,0x100,"%s/\"%s\"",uVar1,local_48);
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,1,0x10);
        }
      }
    }
    if (local_38 != (QArrayData *)0x0) {
      LOCK();
      (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38,2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return pcVar2;
    }
  }
  __stack_chk_fail();
}

Assistant:

char *QTest::toString(const QObject *o)
{
    if (o == nullptr)
        return qstrdup("<null>");

    const QString &name = o->objectName();
    const char *className = o->metaObject()->className();
    char *msg = new char[256];
    if (name.isEmpty())
        std::snprintf(msg, 256, "%s/%p", className, o);
    else
        std::snprintf(msg, 256, "%s/\"%s\"", className, qPrintable(name));
    return msg;
}